

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

RepeatedField<double> *
google::protobuf::Arena::CreateArenaCompatible<google::protobuf::RepeatedField<double>>
          (Arena *arena)

{
  Arena *arena_local;
  
  if (arena == (Arena *)0x0) {
    arena_local = (Arena *)operator_new(0x10);
    RepeatedField<double>::RepeatedField((RepeatedField<double> *)arena_local,(Arena *)0x0);
  }
  else {
    arena_local = (Arena *)DoCreateMessage<google::protobuf::RepeatedField<double>>(arena);
  }
  return (RepeatedField<double> *)arena_local;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateArenaCompatible(Arena* arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (PROTOBUF_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }